

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

void freeStack(Stack stack)

{
  Data data;
  Stack stack_local;
  
  while (stack->size != 0) {
    data = pop(stack);
    deepFreeData(data);
  }
  free(stack);
  return;
}

Assistant:

void freeStack(Stack stack) {
    while (stack->size) {
        deepFreeData(pop(stack));
    }
    free(stack);
}